

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_load_inr
          (CImg<unsigned_char> *this,FILE *file,char *filename,float *voxel_size)

{
  ushort *puVar1;
  bool bVar2;
  uint uVar3;
  unsigned_short *ptr;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  CImgArgumentException *this_00;
  pointer_____offset_0x10___ *ppuVar7;
  long lVar8;
  char *pcVar9;
  long lVar10;
  char *pcVar11;
  long lVar12;
  void *pvVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  size_t sVar18;
  int fopt [8];
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  size_t local_48;
  char *local_40;
  FILE *local_38;
  
  local_40 = filename;
  if (file == (FILE *)0x0 && filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar11 = "non-";
    if (this->_is_shared != false) {
      pcVar11 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_inr(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar11,"unsigned char");
LAB_001acd06:
    ppuVar7 = &CImgArgumentException::typeinfo;
LAB_001acd0d:
    __cxa_throw(this_00,ppuVar7,CImgException::~CImgException);
  }
  local_38 = file;
  if (file == (FILE *)0x0) {
    file = (FILE *)cimg::fopen(filename,"rb");
  }
  if (voxel_size == (float *)0x0) {
    voxel_size = (float *)0x0;
  }
  else {
    voxel_size[2] = 1.0;
    voxel_size[0] = 1.0;
    voxel_size[1] = 1.0;
  }
  _load_inr_header(file,(int *)&local_68,voxel_size);
  assign(this,local_68,local_64,local_60,local_5c);
  if ((local_50 == 8 && local_58 == 0) && local_54 == 0) {
    pvVar4 = operator_new__((long)(int)local_5c * (long)(int)local_68);
    uVar3 = this->_depth;
    if (0 < (int)uVar3) {
      uVar14 = (ulong)this->_height;
      lVar16 = 0;
      do {
        if (0 < (int)uVar14) {
          lVar15 = 0;
          do {
            uVar14 = (long)(int)local_5c * (long)(int)local_68;
            if ((FILE *)file == (FILE *)0x0) {
              this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
              pcVar11 = "";
              if (1 < (uint)uVar14) {
                pcVar11 = "s";
              }
              CImgArgumentException::CImgArgumentException
                        (this_00,
                         "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                         ,uVar14,"unsigned char",pcVar11,0,pvVar4);
              goto LAB_001acd06;
            }
            if ((uint)uVar14 != 0) {
              lVar17 = 0;
              local_48 = uVar14;
              do {
                sVar18 = 0x3f00000;
                if (uVar14 < 0x3f00000) {
                  sVar18 = uVar14;
                }
                sVar5 = fread((void *)((long)pvVar4 + lVar17),1,sVar18,(FILE *)file);
                lVar17 = lVar17 + sVar5;
                uVar14 = uVar14 - sVar5;
              } while ((sVar18 == sVar5) && (uVar14 != 0));
              if (uVar14 != 0) {
                cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar17,
                           local_48);
              }
            }
            uVar3 = this->_width;
            if (0 < (int)uVar3) {
              uVar14 = (ulong)this->_spectrum;
              lVar17 = 0;
              pvVar13 = pvVar4;
              do {
                if (0 < (int)uVar14) {
                  lVar8 = 0;
                  do {
                    lVar10 = (ulong)this->_height * (ulong)this->_width;
                    this->_data
                    [(ulong)this->_depth * lVar8 * lVar10 +
                     lVar10 * lVar16 + lVar17 + lVar15 * (ulong)this->_width] =
                         *(uchar *)((long)pvVar13 + lVar8);
                    lVar8 = lVar8 + 1;
                    uVar14 = (ulong)(int)this->_spectrum;
                  } while (lVar8 < (long)uVar14);
                  uVar3 = this->_width;
                  pvVar13 = (void *)((long)pvVar13 + lVar8);
                }
                lVar17 = lVar17 + 1;
              } while (lVar17 < (int)uVar3);
            }
            lVar15 = lVar15 + 1;
            uVar14 = (ulong)(int)this->_height;
          } while (lVar15 < (long)uVar14);
          uVar3 = this->_depth;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < (int)uVar3);
    }
    operator_delete__(pvVar4);
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  if ((bool)((local_54 == 1 && local_58 == 0) & local_50 == 8 & ~bVar2)) {
    pvVar4 = operator_new__((long)(int)local_5c * (long)(int)local_68);
    uVar3 = this->_depth;
    if (0 < (int)uVar3) {
      uVar14 = (ulong)this->_height;
      lVar16 = 0;
      do {
        if (0 < (int)uVar14) {
          lVar15 = 0;
          do {
            uVar14 = (long)(int)local_5c * (long)(int)local_68;
            if ((FILE *)file == (FILE *)0x0) {
              this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
              pcVar11 = "";
              if (1 < (uint)uVar14) {
                pcVar11 = "s";
              }
              CImgArgumentException::CImgArgumentException
                        (this_00,
                         "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                         ,uVar14,"char",pcVar11,0,pvVar4);
              goto LAB_001acd06;
            }
            if ((uint)uVar14 != 0) {
              lVar17 = 0;
              local_48 = uVar14;
              do {
                sVar18 = 0x3f00000;
                if (uVar14 < 0x3f00000) {
                  sVar18 = uVar14;
                }
                sVar5 = fread((void *)((long)pvVar4 + lVar17),1,sVar18,(FILE *)file);
                lVar17 = lVar17 + sVar5;
                uVar14 = uVar14 - sVar5;
              } while ((sVar18 == sVar5) && (uVar14 != 0));
              if (uVar14 != 0) {
                cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar17,
                           local_48);
              }
            }
            uVar3 = this->_width;
            if (0 < (int)uVar3) {
              uVar14 = (ulong)this->_spectrum;
              lVar17 = 0;
              pvVar13 = pvVar4;
              do {
                if (0 < (int)uVar14) {
                  lVar8 = 0;
                  do {
                    lVar10 = (ulong)this->_height * (ulong)this->_width;
                    this->_data
                    [(ulong)this->_depth * lVar8 * lVar10 +
                     lVar10 * lVar16 + lVar17 + lVar15 * (ulong)this->_width] =
                         *(uchar *)((long)pvVar13 + lVar8);
                    lVar8 = lVar8 + 1;
                    uVar14 = (ulong)(int)this->_spectrum;
                  } while (lVar8 < (long)uVar14);
                  uVar3 = this->_width;
                  pvVar13 = (void *)((long)pvVar13 + lVar8);
                }
                lVar17 = lVar17 + 1;
              } while (lVar17 < (int)uVar3);
            }
            lVar15 = lVar15 + 1;
            uVar14 = (ulong)(int)this->_height;
          } while (lVar15 < (long)uVar14);
          uVar3 = this->_depth;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < (int)uVar3);
    }
    operator_delete__(pvVar4);
    bVar2 = true;
  }
  if ((((!bVar2) && (local_50 == 0x10)) && (local_58 == 0)) && (local_54 == 0)) {
    uVar14 = 0xffffffffffffffff;
    if (-1 < (long)(int)local_5c * (long)(int)local_68) {
      uVar14 = (long)(int)local_5c * (long)(int)local_68 * 2;
    }
    pvVar4 = operator_new__(uVar14);
    uVar3 = this->_depth;
    if (0 < (int)uVar3) {
      uVar14 = (ulong)this->_height;
      lVar16 = 0;
      do {
        if (0 < (int)uVar14) {
          lVar15 = 0;
          do {
            sVar18 = (long)(int)local_5c * (long)(int)local_68;
            if ((FILE *)file == (FILE *)0x0) {
              this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
              pcVar11 = "";
              if (1 < (uint)sVar18) {
                pcVar11 = "s";
              }
              CImgArgumentException::CImgArgumentException
                        (this_00,
                         "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                         ,sVar18,"unsigned short",pcVar11,0,pvVar4);
              goto LAB_001acd06;
            }
            if ((uint)sVar18 != 0) {
              lVar17 = 0;
              local_48 = sVar18;
              do {
                sVar5 = 0x1f80000;
                if (sVar18 * 2 < 0x3f00000) {
                  sVar5 = sVar18;
                }
                sVar6 = fread((void *)((long)pvVar4 + lVar17 * 2),2,sVar5,(FILE *)file);
                lVar17 = lVar17 + sVar6;
                sVar18 = sVar18 - sVar6;
              } while ((sVar5 == sVar6) && (sVar18 != 0));
              if (sVar18 != 0) {
                cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar17,
                           local_48);
              }
            }
            if ((local_4c != 0) && (0 < (int)(local_5c * local_68))) {
              pvVar13 = (void *)((ulong)(local_5c * local_68) * 2 + (long)pvVar4);
              do {
                puVar1 = (ushort *)((long)pvVar13 + -2);
                *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
                pvVar13 = (void *)((long)pvVar13 + -2);
              } while (pvVar4 < pvVar13);
            }
            uVar3 = this->_width;
            if (0 < (int)uVar3) {
              uVar14 = (ulong)this->_spectrum;
              lVar17 = 0;
              pvVar13 = pvVar4;
              do {
                if (0 < (int)uVar14) {
                  lVar8 = 0;
                  lVar10 = 0;
                  do {
                    lVar12 = (ulong)this->_height * (ulong)this->_width;
                    this->_data
                    [(ulong)this->_depth * lVar10 * lVar12 +
                     lVar12 * lVar16 + lVar17 + lVar15 * (ulong)this->_width] =
                         *(uchar *)((long)pvVar13 + lVar10 * 2);
                    lVar10 = lVar10 + 1;
                    uVar14 = (ulong)(int)this->_spectrum;
                    lVar8 = lVar8 + 2;
                  } while (lVar10 < (long)uVar14);
                  uVar3 = this->_width;
                  pvVar13 = (void *)((long)pvVar13 + lVar8);
                }
                lVar17 = lVar17 + 1;
              } while (lVar17 < (int)uVar3);
            }
            lVar15 = lVar15 + 1;
            uVar14 = (ulong)(int)this->_height;
          } while (lVar15 < (long)uVar14);
          uVar3 = this->_depth;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < (int)uVar3);
    }
    operator_delete__(pvVar4);
    bVar2 = true;
  }
  if ((((!bVar2) && (local_50 == 0x10)) && (local_58 == 0)) && (local_54 == 1)) {
    uVar14 = 0xffffffffffffffff;
    if (-1 < (long)(int)local_5c * (long)(int)local_68) {
      uVar14 = (long)(int)local_5c * (long)(int)local_68 * 2;
    }
    pvVar4 = operator_new__(uVar14);
    uVar3 = this->_depth;
    if (0 < (int)uVar3) {
      uVar14 = (ulong)this->_height;
      lVar16 = 0;
      do {
        if (0 < (int)uVar14) {
          lVar15 = 0;
          do {
            sVar18 = (long)(int)local_5c * (long)(int)local_68;
            if ((FILE *)file == (FILE *)0x0) {
              this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
              pcVar11 = "";
              if (1 < (uint)sVar18) {
                pcVar11 = "s";
              }
              CImgArgumentException::CImgArgumentException
                        (this_00,
                         "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                         ,sVar18,"short",pcVar11,0,pvVar4);
              goto LAB_001acd06;
            }
            if ((uint)sVar18 != 0) {
              lVar17 = 0;
              local_48 = sVar18;
              do {
                sVar5 = 0x1f80000;
                if (sVar18 * 2 < 0x3f00000) {
                  sVar5 = sVar18;
                }
                sVar6 = fread((void *)((long)pvVar4 + lVar17 * 2),2,sVar5,(FILE *)file);
                lVar17 = lVar17 + sVar6;
                sVar18 = sVar18 - sVar6;
              } while ((sVar5 == sVar6) && (sVar18 != 0));
              if (sVar18 != 0) {
                cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar17,
                           local_48);
              }
            }
            if ((local_4c != 0) && (0 < (int)(local_5c * local_68))) {
              pvVar13 = (void *)((ulong)(local_5c * local_68) * 2 + (long)pvVar4);
              do {
                puVar1 = (ushort *)((long)pvVar13 + -2);
                *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
                pvVar13 = (void *)((long)pvVar13 + -2);
              } while (pvVar4 < pvVar13);
            }
            uVar3 = this->_width;
            if (0 < (int)uVar3) {
              uVar14 = (ulong)this->_spectrum;
              lVar17 = 0;
              pvVar13 = pvVar4;
              do {
                if (0 < (int)uVar14) {
                  lVar8 = 0;
                  lVar10 = 0;
                  do {
                    lVar12 = (ulong)this->_height * (ulong)this->_width;
                    this->_data
                    [(ulong)this->_depth * lVar10 * lVar12 +
                     lVar12 * lVar16 + lVar17 + lVar15 * (ulong)this->_width] =
                         *(uchar *)((long)pvVar13 + lVar10 * 2);
                    lVar10 = lVar10 + 1;
                    uVar14 = (ulong)(int)this->_spectrum;
                    lVar8 = lVar8 + 2;
                  } while (lVar10 < (long)uVar14);
                  uVar3 = this->_width;
                  pvVar13 = (void *)((long)pvVar13 + lVar8);
                }
                lVar17 = lVar17 + 1;
              } while (lVar17 < (int)uVar3);
            }
            lVar15 = lVar15 + 1;
            uVar14 = (ulong)(int)this->_height;
          } while (lVar15 < (long)uVar14);
          uVar3 = this->_depth;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < (int)uVar3);
    }
    operator_delete__(pvVar4);
    bVar2 = true;
  }
  if ((((!bVar2) && (local_50 == 0x20)) && (local_58 == 0)) && (local_54 == 0)) {
    uVar14 = 0xffffffffffffffff;
    if ((ulong)((long)(int)local_5c * (long)(int)local_68) < 0x4000000000000000) {
      uVar14 = (long)(int)local_5c * (long)(int)local_68 * 4;
    }
    pvVar4 = operator_new__(uVar14);
    uVar3 = this->_depth;
    if (0 < (int)uVar3) {
      uVar14 = (ulong)this->_height;
      lVar16 = 0;
      do {
        if (0 < (int)uVar14) {
          lVar15 = 0;
          do {
            sVar18 = (long)(int)local_5c * (long)(int)local_68;
            if ((FILE *)file == (FILE *)0x0) {
              this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
              pcVar11 = "";
              if (1 < (uint)sVar18) {
                pcVar11 = "s";
              }
              CImgArgumentException::CImgArgumentException
                        (this_00,
                         "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                         ,sVar18,"unsigned int",pcVar11,0,pvVar4);
              goto LAB_001acd06;
            }
            if ((uint)sVar18 != 0) {
              lVar17 = 0;
              local_48 = sVar18;
              do {
                sVar5 = 0xfc0000;
                if (sVar18 * 4 < 0x3f00000) {
                  sVar5 = sVar18;
                }
                sVar6 = fread((void *)((long)pvVar4 + lVar17 * 4),4,sVar5,(FILE *)file);
                lVar17 = lVar17 + sVar6;
                sVar18 = sVar18 - sVar6;
              } while ((sVar5 == sVar6) && (sVar18 != 0));
              if (sVar18 != 0) {
                cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar17,
                           local_48);
              }
            }
            if ((local_4c != 0) && (0 < (int)(local_5c * local_68))) {
              pvVar13 = (void *)((ulong)(local_5c * local_68) * 4 + (long)pvVar4);
              do {
                uVar3 = *(uint *)((long)pvVar13 - 4);
                *(uint *)((long)pvVar13 - 4) =
                     uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18
                ;
                pvVar13 = (void *)((long)pvVar13 - 4);
              } while (pvVar4 < pvVar13);
            }
            uVar3 = this->_width;
            if (0 < (int)uVar3) {
              uVar14 = (ulong)this->_spectrum;
              lVar17 = 0;
              pvVar13 = pvVar4;
              do {
                if (0 < (int)uVar14) {
                  lVar8 = 0;
                  lVar10 = 0;
                  do {
                    lVar12 = (ulong)this->_height * (ulong)this->_width;
                    this->_data
                    [(ulong)this->_depth * lVar10 * lVar12 +
                     lVar12 * lVar16 + lVar17 + lVar15 * (ulong)this->_width] =
                         *(uchar *)((long)pvVar13 + lVar10 * 4);
                    lVar10 = lVar10 + 1;
                    uVar14 = (ulong)(int)this->_spectrum;
                    lVar8 = lVar8 + 4;
                  } while (lVar10 < (long)uVar14);
                  uVar3 = this->_width;
                  pvVar13 = (void *)((long)pvVar13 + lVar8);
                }
                lVar17 = lVar17 + 1;
              } while (lVar17 < (int)uVar3);
            }
            lVar15 = lVar15 + 1;
            uVar14 = (ulong)(int)this->_height;
          } while (lVar15 < (long)uVar14);
          uVar3 = this->_depth;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < (int)uVar3);
    }
    operator_delete__(pvVar4);
    bVar2 = true;
  }
  if ((((!bVar2) && (local_50 == 0x20)) && (local_58 == 0)) && (local_54 == 1)) {
    uVar14 = 0xffffffffffffffff;
    if ((ulong)((long)(int)local_5c * (long)(int)local_68) < 0x4000000000000000) {
      uVar14 = (long)(int)local_5c * (long)(int)local_68 * 4;
    }
    pvVar4 = operator_new__(uVar14);
    uVar3 = this->_depth;
    if (0 < (int)uVar3) {
      uVar14 = (ulong)this->_height;
      lVar16 = 0;
      do {
        if (0 < (int)uVar14) {
          lVar15 = 0;
          do {
            sVar18 = (long)(int)local_5c * (long)(int)local_68;
            if ((FILE *)file == (FILE *)0x0) {
              this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
              pcVar11 = "";
              if (1 < (uint)sVar18) {
                pcVar11 = "s";
              }
              CImgArgumentException::CImgArgumentException
                        (this_00,
                         "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                         ,sVar18,"int",pcVar11,0,pvVar4);
              goto LAB_001acd06;
            }
            if ((uint)sVar18 != 0) {
              lVar17 = 0;
              local_48 = sVar18;
              do {
                sVar5 = 0xfc0000;
                if (sVar18 * 4 < 0x3f00000) {
                  sVar5 = sVar18;
                }
                sVar6 = fread((void *)((long)pvVar4 + lVar17 * 4),4,sVar5,(FILE *)file);
                lVar17 = lVar17 + sVar6;
                sVar18 = sVar18 - sVar6;
              } while ((sVar5 == sVar6) && (sVar18 != 0));
              if (sVar18 != 0) {
                cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar17,
                           local_48);
              }
            }
            if ((local_4c != 0) && (0 < (int)(local_5c * local_68))) {
              pvVar13 = (void *)((ulong)(local_5c * local_68) * 4 + (long)pvVar4);
              do {
                uVar3 = *(uint *)((long)pvVar13 - 4);
                *(uint *)((long)pvVar13 - 4) =
                     uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18
                ;
                pvVar13 = (void *)((long)pvVar13 - 4);
              } while (pvVar4 < pvVar13);
            }
            uVar3 = this->_width;
            if (0 < (int)uVar3) {
              uVar14 = (ulong)this->_spectrum;
              lVar17 = 0;
              pvVar13 = pvVar4;
              do {
                if (0 < (int)uVar14) {
                  lVar8 = 0;
                  lVar10 = 0;
                  do {
                    lVar12 = (ulong)this->_height * (ulong)this->_width;
                    this->_data
                    [(ulong)this->_depth * lVar10 * lVar12 +
                     lVar12 * lVar16 + lVar17 + lVar15 * (ulong)this->_width] =
                         *(uchar *)((long)pvVar13 + lVar10 * 4);
                    lVar10 = lVar10 + 1;
                    uVar14 = (ulong)(int)this->_spectrum;
                    lVar8 = lVar8 + 4;
                  } while (lVar10 < (long)uVar14);
                  uVar3 = this->_width;
                  pvVar13 = (void *)((long)pvVar13 + lVar8);
                }
                lVar17 = lVar17 + 1;
              } while (lVar17 < (int)uVar3);
            }
            lVar15 = lVar15 + 1;
            uVar14 = (ulong)(int)this->_height;
          } while (lVar15 < (long)uVar14);
          uVar3 = this->_depth;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < (int)uVar3);
    }
    operator_delete__(pvVar4);
    bVar2 = true;
  }
  if ((((!bVar2) && (local_50 == 0x20)) && (local_58 == 1)) && (local_54 == 0)) {
    uVar14 = 0xffffffffffffffff;
    if ((ulong)((long)(int)local_5c * (long)(int)local_68) < 0x4000000000000000) {
      uVar14 = (long)(int)local_5c * (long)(int)local_68 * 4;
    }
    pvVar4 = operator_new__(uVar14);
    uVar3 = this->_depth;
    if (0 < (int)uVar3) {
      uVar14 = (ulong)this->_height;
      lVar16 = 0;
      do {
        if (0 < (int)uVar14) {
          lVar15 = 0;
          do {
            sVar18 = (long)(int)local_5c * (long)(int)local_68;
            if ((FILE *)file == (FILE *)0x0) {
              this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
              pcVar11 = "";
              if (1 < (uint)sVar18) {
                pcVar11 = "s";
              }
              CImgArgumentException::CImgArgumentException
                        (this_00,
                         "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                         ,sVar18,"float",pcVar11,0,pvVar4);
              goto LAB_001acd06;
            }
            if ((uint)sVar18 != 0) {
              lVar17 = 0;
              local_48 = sVar18;
              do {
                sVar5 = 0xfc0000;
                if (sVar18 * 4 < 0x3f00000) {
                  sVar5 = sVar18;
                }
                sVar6 = fread((void *)((long)pvVar4 + lVar17 * 4),4,sVar5,(FILE *)file);
                lVar17 = lVar17 + sVar6;
                sVar18 = sVar18 - sVar6;
              } while ((sVar5 == sVar6) && (sVar18 != 0));
              if (sVar18 != 0) {
                cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar17,
                           local_48);
              }
            }
            if ((local_4c != 0) && (0 < (int)(local_5c * local_68))) {
              pvVar13 = (void *)((ulong)(local_5c * local_68) * 4 + (long)pvVar4);
              do {
                uVar3 = *(uint *)((long)pvVar13 - 4);
                *(uint *)((long)pvVar13 - 4) =
                     uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18
                ;
                pvVar13 = (void *)((long)pvVar13 - 4);
              } while (pvVar4 < pvVar13);
            }
            uVar3 = this->_width;
            if (0 < (int)uVar3) {
              uVar14 = (ulong)this->_spectrum;
              lVar17 = 0;
              pvVar13 = pvVar4;
              do {
                if (0 < (int)uVar14) {
                  lVar8 = 0;
                  lVar10 = 0;
                  do {
                    lVar12 = (ulong)this->_height * (ulong)this->_width;
                    this->_data
                    [(ulong)this->_depth * lVar10 * lVar12 +
                     lVar12 * lVar16 + lVar17 + lVar15 * (ulong)this->_width] =
                         (uchar)(int)*(float *)((long)pvVar13 + lVar10 * 4);
                    lVar10 = lVar10 + 1;
                    uVar14 = (ulong)(int)this->_spectrum;
                    lVar8 = lVar8 + 4;
                  } while (lVar10 < (long)uVar14);
                  uVar3 = this->_width;
                  pvVar13 = (void *)((long)pvVar13 + lVar8);
                }
                lVar17 = lVar17 + 1;
              } while (lVar17 < (int)uVar3);
            }
            lVar15 = lVar15 + 1;
            uVar14 = (ulong)(int)this->_height;
          } while (lVar15 < (long)uVar14);
          uVar3 = this->_depth;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < (int)uVar3);
    }
    operator_delete__(pvVar4);
    bVar2 = true;
  }
  if ((((!bVar2) && (local_50 == 0x20)) && (local_58 == 1)) && (local_54 == 1)) {
    uVar14 = 0xffffffffffffffff;
    if ((ulong)((long)(int)local_5c * (long)(int)local_68) < 0x4000000000000000) {
      uVar14 = (long)(int)local_5c * (long)(int)local_68 * 4;
    }
    pvVar4 = operator_new__(uVar14);
    uVar3 = this->_depth;
    if (0 < (int)uVar3) {
      uVar14 = (ulong)this->_height;
      lVar16 = 0;
      do {
        if (0 < (int)uVar14) {
          lVar15 = 0;
          do {
            sVar18 = (long)(int)local_5c * (long)(int)local_68;
            if ((FILE *)file == (FILE *)0x0) {
              this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
              pcVar11 = "";
              if (1 < (uint)sVar18) {
                pcVar11 = "s";
              }
              CImgArgumentException::CImgArgumentException
                        (this_00,
                         "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                         ,sVar18,"float",pcVar11,0,pvVar4);
              goto LAB_001acd06;
            }
            if ((uint)sVar18 != 0) {
              lVar17 = 0;
              local_48 = sVar18;
              do {
                sVar5 = 0xfc0000;
                if (sVar18 * 4 < 0x3f00000) {
                  sVar5 = sVar18;
                }
                sVar6 = fread((void *)((long)pvVar4 + lVar17 * 4),4,sVar5,(FILE *)file);
                lVar17 = lVar17 + sVar6;
                sVar18 = sVar18 - sVar6;
              } while ((sVar5 == sVar6) && (sVar18 != 0));
              if (sVar18 != 0) {
                cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar17,
                           local_48);
              }
            }
            if ((local_4c != 0) && (0 < (int)(local_5c * local_68))) {
              pvVar13 = (void *)((ulong)(local_5c * local_68) * 4 + (long)pvVar4);
              do {
                uVar3 = *(uint *)((long)pvVar13 - 4);
                *(uint *)((long)pvVar13 - 4) =
                     uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18
                ;
                pvVar13 = (void *)((long)pvVar13 - 4);
              } while (pvVar4 < pvVar13);
            }
            uVar3 = this->_width;
            if (0 < (int)uVar3) {
              uVar14 = (ulong)this->_spectrum;
              lVar17 = 0;
              pvVar13 = pvVar4;
              do {
                if (0 < (int)uVar14) {
                  lVar8 = 0;
                  lVar10 = 0;
                  do {
                    lVar12 = (ulong)this->_height * (ulong)this->_width;
                    this->_data
                    [(ulong)this->_depth * lVar10 * lVar12 +
                     lVar12 * lVar16 + lVar17 + lVar15 * (ulong)this->_width] =
                         (uchar)(int)*(float *)((long)pvVar13 + lVar10 * 4);
                    lVar10 = lVar10 + 1;
                    uVar14 = (ulong)(int)this->_spectrum;
                    lVar8 = lVar8 + 4;
                  } while (lVar10 < (long)uVar14);
                  uVar3 = this->_width;
                  pvVar13 = (void *)((long)pvVar13 + lVar8);
                }
                lVar17 = lVar17 + 1;
              } while (lVar17 < (int)uVar3);
            }
            lVar15 = lVar15 + 1;
            uVar14 = (ulong)(int)this->_height;
          } while (lVar15 < (long)uVar14);
          uVar3 = this->_depth;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < (int)uVar3);
    }
    operator_delete__(pvVar4);
    bVar2 = true;
  }
  if ((((!bVar2) && (local_50 == 0x40)) && (local_58 == 1)) && (local_54 == 0)) {
    pvVar4 = operator_new__(-(ulong)((ulong)((long)(int)local_5c * (long)(int)local_68) >> 0x3d != 0
                                    ) | (long)(int)local_5c * (long)(int)local_68 * 8);
    uVar3 = this->_depth;
    if (0 < (int)uVar3) {
      uVar14 = (ulong)this->_height;
      lVar16 = 0;
      do {
        if (0 < (int)uVar14) {
          lVar15 = 0;
          do {
            sVar18 = (long)(int)local_5c * (long)(int)local_68;
            if ((FILE *)file == (FILE *)0x0) {
              this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
              pcVar11 = "";
              if (1 < (uint)sVar18) {
                pcVar11 = "s";
              }
              CImgArgumentException::CImgArgumentException
                        (this_00,
                         "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                         ,sVar18,"double",pcVar11,0,pvVar4);
              goto LAB_001acd06;
            }
            if ((uint)sVar18 != 0) {
              lVar17 = 0;
              local_48 = sVar18;
              do {
                sVar5 = 0x7e0000;
                if (sVar18 * 8 < 0x3f00000) {
                  sVar5 = sVar18;
                }
                sVar6 = fread((void *)((long)pvVar4 + lVar17 * 8),8,sVar5,(FILE *)file);
                lVar17 = lVar17 + sVar6;
                sVar18 = sVar18 - sVar6;
              } while ((sVar5 == sVar6) && (sVar18 != 0));
              if (sVar18 != 0) {
                cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar17,
                           local_48);
              }
            }
            if ((local_4c != 0) && (0 < (int)(local_5c * local_68))) {
              pvVar13 = (void *)((ulong)(local_5c * local_68) * 8 + (long)pvVar4);
              do {
                uVar14 = *(ulong *)((long)pvVar13 - 8);
                *(ulong *)((long)pvVar13 - 8) =
                     uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 |
                     (uVar14 & 0xff0000000000) >> 0x18 | (uVar14 & 0xff00000000) >> 8 |
                     (uVar14 & 0xff000000) << 8 | (uVar14 & 0xff0000) << 0x18 |
                     (uVar14 & 0xff00) << 0x28 | uVar14 << 0x38;
                pvVar13 = (void *)((long)pvVar13 - 8);
              } while (pvVar4 < pvVar13);
            }
            uVar3 = this->_width;
            if (0 < (int)uVar3) {
              uVar14 = (ulong)this->_spectrum;
              lVar17 = 0;
              pvVar13 = pvVar4;
              do {
                if (0 < (int)uVar14) {
                  lVar8 = 0;
                  lVar10 = 0;
                  do {
                    lVar12 = (ulong)this->_height * (ulong)this->_width;
                    this->_data
                    [(ulong)this->_depth * lVar10 * lVar12 +
                     lVar12 * lVar16 + lVar17 + lVar15 * (ulong)this->_width] =
                         (uchar)(int)*(double *)((long)pvVar13 + lVar10 * 8);
                    lVar10 = lVar10 + 1;
                    uVar14 = (ulong)(int)this->_spectrum;
                    lVar8 = lVar8 + 8;
                  } while (lVar10 < (long)uVar14);
                  uVar3 = this->_width;
                  pvVar13 = (void *)((long)pvVar13 + lVar8);
                }
                lVar17 = lVar17 + 1;
              } while (lVar17 < (int)uVar3);
            }
            lVar15 = lVar15 + 1;
            uVar14 = (ulong)(int)this->_height;
          } while (lVar15 < (long)uVar14);
          uVar3 = this->_depth;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < (int)uVar3);
    }
    operator_delete__(pvVar4);
    bVar2 = true;
  }
  if ((((bVar2) || (local_50 != 0x40)) || (local_58 != 1)) || (local_54 != 1)) {
    if (!bVar2) {
      if (local_38 == (FILE *)0x0) {
        cimg::fclose((FILE *)file);
      }
      this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
      pcVar11 = "non-";
      if (this->_is_shared != false) {
        pcVar11 = "";
      }
      pcVar9 = "(FILE*)";
      if (local_40 != (char *)0x0) {
        pcVar9 = local_40;
      }
      CImgIOException::CImgIOException
                ((CImgIOException *)this_00,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_inr(): Unknown pixel type defined in file \'%s\'."
                 ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                 (ulong)this->_spectrum,this->_data,pcVar11,"unsigned char",pcVar9);
      ppuVar7 = &CImgIOException::typeinfo;
      goto LAB_001acd0d;
    }
  }
  else {
    pvVar4 = operator_new__(-(ulong)((ulong)((long)(int)local_5c * (long)(int)local_68) >> 0x3d != 0
                                    ) | (long)(int)local_5c * (long)(int)local_68 * 8);
    uVar3 = this->_depth;
    if (0 < (int)uVar3) {
      uVar14 = (ulong)this->_height;
      lVar16 = 0;
      do {
        if (0 < (int)uVar14) {
          lVar15 = 0;
          do {
            sVar18 = (long)(int)local_5c * (long)(int)local_68;
            if ((FILE *)file == (FILE *)0x0) {
              this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
              pcVar11 = "";
              if (1 < (uint)sVar18) {
                pcVar11 = "s";
              }
              CImgArgumentException::CImgArgumentException
                        (this_00,
                         "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                         ,sVar18,"double",pcVar11,0,pvVar4);
              goto LAB_001acd06;
            }
            if ((uint)sVar18 != 0) {
              lVar17 = 0;
              local_48 = sVar18;
              do {
                sVar5 = 0x7e0000;
                if (sVar18 * 8 < 0x3f00000) {
                  sVar5 = sVar18;
                }
                sVar6 = fread((void *)((long)pvVar4 + lVar17 * 8),8,sVar5,(FILE *)file);
                lVar17 = lVar17 + sVar6;
                sVar18 = sVar18 - sVar6;
              } while ((sVar5 == sVar6) && (sVar18 != 0));
              if (sVar18 != 0) {
                cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar17,
                           local_48);
              }
            }
            if ((local_4c != 0) && (0 < (int)(local_5c * local_68))) {
              pvVar13 = (void *)((long)pvVar4 + (ulong)(local_5c * local_68) * 8);
              do {
                uVar14 = *(ulong *)((long)pvVar13 - 8);
                *(ulong *)((long)pvVar13 - 8) =
                     uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 |
                     (uVar14 & 0xff0000000000) >> 0x18 | (uVar14 & 0xff00000000) >> 8 |
                     (uVar14 & 0xff000000) << 8 | (uVar14 & 0xff0000) << 0x18 |
                     (uVar14 & 0xff00) << 0x28 | uVar14 << 0x38;
                pvVar13 = (void *)((long)pvVar13 - 8);
              } while (pvVar4 < pvVar13);
            }
            uVar3 = this->_width;
            if (0 < (int)uVar3) {
              uVar14 = (ulong)this->_spectrum;
              lVar17 = 0;
              pvVar13 = pvVar4;
              do {
                if (0 < (int)uVar14) {
                  lVar8 = 0;
                  lVar10 = 0;
                  do {
                    lVar12 = (ulong)this->_height * (ulong)this->_width;
                    this->_data
                    [(ulong)this->_depth * lVar10 * lVar12 +
                     lVar12 * lVar16 + lVar17 + lVar15 * (ulong)this->_width] =
                         (uchar)(int)*(double *)((long)pvVar13 + lVar10 * 8);
                    lVar10 = lVar10 + 1;
                    uVar14 = (ulong)(int)this->_spectrum;
                    lVar8 = lVar8 + 8;
                  } while (lVar10 < (long)uVar14);
                  uVar3 = this->_width;
                  pvVar13 = (void *)((long)pvVar13 + lVar8);
                }
                lVar17 = lVar17 + 1;
              } while (lVar17 < (int)uVar3);
            }
            lVar15 = lVar15 + 1;
            uVar14 = (ulong)(int)this->_height;
          } while (lVar15 < (long)uVar14);
          uVar3 = this->_depth;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < (int)uVar3);
    }
    operator_delete__(pvVar4);
  }
  if (local_38 == (FILE *)0x0) {
    if ((FILE *)file == (FILE *)0x0) {
      cimg::warn("cimg::fclose(): Specified file is (null).");
    }
    else if ((_stdin != (FILE *)file) && (_stdout != (FILE *)file)) {
      uVar3 = fclose((FILE *)file);
      if (uVar3 != 0) {
        cimg::warn("cimg::fclose(): Error code %d returned during file closing.",(ulong)uVar3);
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& _load_inr(std::FILE *const file, const char *const filename, float *const voxel_size) {
#define _cimg_load_inr_case(Tf,sign,pixsize,Ts) \
     if (!loaded && fopt[6]==pixsize && fopt[4]==Tf && fopt[5]==sign) { \
        Ts *xval, *const val = new Ts[(size_t)fopt[0]*fopt[3]]; \
        cimg_forYZ(*this,y,z) { \
            cimg::fread(val,fopt[0]*fopt[3],nfile); \
            if (fopt[7]!=endian) cimg::invert_endianness(val,fopt[0]*fopt[3]); \
            xval = val; cimg_forX(*this,x) cimg_forC(*this,c) (*this)(x,y,z,c) = (T)*(xval++); \
          } \
        delete[] val; \
        loaded = true; \
      }

      if (!file && !filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_inr(): Specified filename is (null).",
                                    cimg_instance);

      std::FILE *const nfile = file?file:cimg::fopen(filename,"rb");
      int fopt[8], endian = cimg::endianness()?1:0;
      bool loaded = false;
      if (voxel_size) voxel_size[0] = voxel_size[1] = voxel_size[2] = 1;
      _load_inr_header(nfile,fopt,voxel_size);
      assign(fopt[0],fopt[1],fopt[2],fopt[3]);
      _cimg_load_inr_case(0,0,8,unsigned char);
      _cimg_load_inr_case(0,1,8,char);
      _cimg_load_inr_case(0,0,16,unsigned short);
      _cimg_load_inr_case(0,1,16,short);
      _cimg_load_inr_case(0,0,32,unsigned int);
      _cimg_load_inr_case(0,1,32,int);
      _cimg_load_inr_case(1,0,32,float);
      _cimg_load_inr_case(1,1,32,float);
      _cimg_load_inr_case(1,0,64,double);
      _cimg_load_inr_case(1,1,64,double);
      if (!loaded) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_inr(): Unknown pixel type defined in file '%s'.",
                              cimg_instance,
                              filename?filename:"(FILE*)");
      }
      if (!file) cimg::fclose(nfile);
      return *this;
    }